

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CovarianceMatrix.cpp
# Opt level: O3

void __thiscall CovarianceMatrix::modelToQueries(CovarianceMatrix *this)

{
  pointer *pppAVar1;
  pointer *pppQVar2;
  _WordT *p_Var3;
  QueryCompiler *pQVar4;
  iterator __position;
  bool bVar5;
  Function *pFVar6;
  Aggregate *this_00;
  Query *pQVar7;
  Query **__args;
  size_t var;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  iterator iVar11;
  ulong uVar12;
  ulong uVar13;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  Query *linear;
  Aggregate *agg_quad;
  Query *quad;
  Query *count;
  Aggregate *agg_count;
  Aggregate *agg_linear;
  prod_bitset prod_linear_v1;
  prod_bitset prod_quad_v1;
  size_t featureToFunction [100];
  size_t quadFeatureToFunction [100];
  Query *local_980;
  Query *local_978;
  vector<Query*,std::allocator<Query*>> *local_970;
  var_bitset *local_968;
  var_bitset *local_960;
  Query *local_958;
  Query *local_950;
  ulong local_948;
  ulong local_940;
  ulong local_938;
  size_t local_930;
  ulong local_928;
  Aggregate *local_920;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_918;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_8e8;
  bitset<1500UL> local_8b8;
  bitset<1500UL> local_7f8;
  bitset<1500UL> local_738;
  ulong auStack_678 [100];
  ulong auStack_358 [101];
  
  local_960 = &(this->super_Application)._features;
  local_968 = &this->_categoricalFeatures;
  uVar12 = 0;
  sVar8 = 0;
  do {
    bVar5 = std::bitset<100UL>::test(local_960,sVar8);
    if ((bVar5) && (bVar5 = std::bitset<100UL>::test(local_968,sVar8), !bVar5)) {
      pQVar4 = (this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      pFVar6 = (Function *)operator_new(0x48);
      __l._M_len = 1;
      __l._M_array = (iterator)&local_7f8;
      local_7f8.super__Base_bitset<24UL>._M_w[0] = sVar8;
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 &local_8e8,__l,(less<unsigned_long> *)&local_738,(allocator_type *)&local_8b8);
      Function::Function(pFVar6,(set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                                 *)&local_8e8,sum);
      QueryCompiler::addFunction(pQVar4,pFVar6);
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree(&local_8e8);
      auStack_678[sVar8] = uVar12;
      uVar12 = uVar12 + 1;
    }
    sVar8 = sVar8 + 1;
  } while (sVar8 != 100);
  sVar8 = 0;
  do {
    bVar5 = std::bitset<100UL>::test(local_960,sVar8);
    if ((bVar5) && (bVar5 = std::bitset<100UL>::test(local_968,sVar8), !bVar5)) {
      pQVar4 = (this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      pFVar6 = (Function *)operator_new(0x48);
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&local_7f8;
      local_7f8.super__Base_bitset<24UL>._M_w[0] = sVar8;
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 &local_918,__l_00,(less<unsigned_long> *)&local_738,(allocator_type *)&local_8b8);
      Function::Function(pFVar6,(set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                                 *)&local_918,quadratic_sum);
      QueryCompiler::addFunction(pQVar4,pFVar6);
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree(&local_918);
      auStack_358[sVar8] = uVar12;
      uVar12 = uVar12 + 1;
    }
    sVar8 = sVar8 + 1;
  } while (sVar8 != 100);
  this_00 = (Aggregate *)operator_new(0x30);
  (this_00->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->_incoming).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->_incoming).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->_incoming).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_920 = this_00;
  memset(&local_7f8,0,0xc0);
  std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
  _M_realloc_insert<std::bitset<1500ul>>
            ((vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)this_00,
             (iterator)0x0,&local_7f8);
  local_950 = (Query *)operator_new(0x30);
  (local_950->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
  (local_950->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
  (local_950->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_950->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_950->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Aggregate*,std::allocator<Aggregate*>>::_M_realloc_insert<Aggregate*const&>
            ((vector<Aggregate*,std::allocator<Aggregate*>> *)&local_950->_aggregates,(iterator)0x0,
             &local_920);
  local_950->_rootID =
       ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_root
       ->_id;
  QueryCompiler::addQuery
            ((this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             local_950);
  local_970 = (vector<Query*,std::allocator<Query*>> *)&this->listOfQueries;
  iVar11._M_current =
       (this->listOfQueries).super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar11._M_current ==
      (this->listOfQueries).super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Query*,std::allocator<Query*>>::_M_realloc_insert<Query*const&>
              (local_970,iVar11,&local_950);
  }
  else {
    *iVar11._M_current = local_950;
    pppQVar2 = &(this->listOfQueries).super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppQVar2 = *pppQVar2 + 1;
  }
  local_930 = ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->_root->_id;
  uVar12 = 1;
  uVar13 = 0;
  do {
    local_938 = uVar13 >> 6;
    local_940 = 1L << ((byte)uVar13 & 0x3f);
    if (((local_960->super__Base_bitset<2UL>)._M_w[local_938] >> (uVar13 & 0x3f) & 1) != 0) {
      memset(&local_7f8,0,0xc0);
      memset(&local_738,0,0xc0);
      uVar9 = local_938;
      uVar10 = local_940;
      if (((local_968->super__Base_bitset<2UL>)._M_w[local_938] & local_940) == 0) {
        uVar10 = auStack_678[uVar13];
        if (0x5db < uVar10) {
LAB_00196761:
          std::__throw_out_of_range_fmt
                    ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",uVar10,
                     0x5dc);
        }
        p_Var3 = local_7f8.super__Base_bitset<24UL>._M_w + (uVar10 >> 6);
        *p_Var3 = *p_Var3 | 1L << ((byte)uVar10 & 0x3f);
        local_8b8.super__Base_bitset<24UL>._M_w[0] = (_WordT)operator_new(0x30);
        *(undefined8 *)
         &((vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)
          local_8b8.super__Base_bitset<24UL>._M_w[0])->field_0x0 = 0;
        *(undefined8 *)(local_8b8.super__Base_bitset<24UL>._M_w[0] + 8) = 0;
        *(undefined8 *)(local_8b8.super__Base_bitset<24UL>._M_w[0] + 0x10) = 0;
        *(undefined8 *)(local_8b8.super__Base_bitset<24UL>._M_w[0] + 0x18) = 0;
        *(undefined8 *)(local_8b8.super__Base_bitset<24UL>._M_w[0] + 0x20) = 0;
        *(undefined8 *)(local_8b8.super__Base_bitset<24UL>._M_w[0] + 0x28) = 0;
        std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
        _M_realloc_insert<std::bitset<1500ul>const&>
                  ((vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)
                   local_8b8.super__Base_bitset<24UL>._M_w[0],(iterator)0x0,&local_7f8);
        local_980 = (Query *)operator_new(0x30);
        (local_980->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
        (local_980->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
        (local_980->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (local_980->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_980->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<Aggregate*,std::allocator<Aggregate*>>::_M_realloc_insert<Aggregate*const&>
                  ((vector<Aggregate*,std::allocator<Aggregate*>> *)&local_980->_aggregates,
                   (iterator)0x0,(Aggregate **)&local_8b8);
        local_980->_rootID = local_930;
        QueryCompiler::addQuery
                  ((this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,local_980);
        iVar11._M_current =
             (this->listOfQueries).super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar11._M_current ==
            (this->listOfQueries).super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Query*,std::allocator<Query*>>::_M_realloc_insert<Query*const&>
                    (local_970,iVar11,&local_980);
        }
        else {
          *iVar11._M_current = local_980;
          pppQVar2 = &(this->listOfQueries).super__Vector_base<Query_*,_std::allocator<Query_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppQVar2 = *pppQVar2 + 1;
        }
        uVar10 = auStack_358[uVar13];
        if (0x5db < uVar10) goto LAB_00196761;
        p_Var3 = local_738.super__Base_bitset<24UL>._M_w + (uVar10 >> 6);
        *p_Var3 = *p_Var3 | 1L << ((byte)uVar10 & 0x3f);
        local_978 = (Query *)operator_new(0x30);
        local_978->_rootID = 0;
        (local_978->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
        (local_978->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
        (local_978->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (local_978->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_978->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
        _M_realloc_insert<std::bitset<1500ul>const&>
                  ((vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)local_978,
                   (iterator)0x0,&local_738);
        local_958 = (Query *)operator_new(0x30);
        (local_958->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
        (local_958->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
        (local_958->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (local_958->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_958->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<Aggregate*,std::allocator<Aggregate*>>::_M_realloc_insert<Aggregate*const&>
                  ((vector<Aggregate*,std::allocator<Aggregate*>> *)&local_958->_aggregates,
                   (iterator)0x0,(Aggregate **)&local_978);
        local_958->_rootID =
             ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->_root->_id;
        QueryCompiler::addQuery
                  ((this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,local_958);
        iVar11._M_current =
             (this->listOfQueries).super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        pQVar7 = local_958;
        if (iVar11._M_current !=
            (this->listOfQueries).super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) goto LAB_0019656a;
        __args = &local_958;
LAB_00196581:
        std::vector<Query*,std::allocator<Query*>>::_M_realloc_insert<Query*const&>
                  (local_970,iVar11,__args);
      }
      else {
        local_8b8.super__Base_bitset<24UL>._M_w[0] = (_WordT)operator_new(0x30);
        *(undefined8 *)
         &((vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)
          local_8b8.super__Base_bitset<24UL>._M_w[0])->field_0x0 = 0;
        *(undefined8 *)(local_8b8.super__Base_bitset<24UL>._M_w[0] + 8) = 0;
        *(undefined8 *)(local_8b8.super__Base_bitset<24UL>._M_w[0] + 0x10) = 0;
        *(undefined8 *)(local_8b8.super__Base_bitset<24UL>._M_w[0] + 0x18) = 0;
        *(undefined8 *)(local_8b8.super__Base_bitset<24UL>._M_w[0] + 0x20) = 0;
        *(undefined8 *)(local_8b8.super__Base_bitset<24UL>._M_w[0] + 0x28) = 0;
        std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
        _M_realloc_insert<std::bitset<1500ul>const&>
                  ((vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)
                   local_8b8.super__Base_bitset<24UL>._M_w[0],(iterator)0x0,&local_7f8);
        local_980 = (Query *)operator_new(0x30);
        (local_980->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
        (local_980->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
        (local_980->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (local_980->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_980->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<Aggregate*,std::allocator<Aggregate*>>::_M_realloc_insert<Aggregate*const&>
                  ((vector<Aggregate*,std::allocator<Aggregate*>> *)&local_980->_aggregates,
                   (iterator)0x0,(Aggregate **)&local_8b8);
        p_Var3 = (local_980->_fVars).super__Base_bitset<2UL>._M_w + uVar9;
        *p_Var3 = *p_Var3 | uVar10;
        local_980->_rootID = this->_queryRootIndex[uVar13];
        QueryCompiler::addQuery
                  ((this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,local_980);
        iVar11._M_current =
             (this->listOfQueries).super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        pQVar7 = local_980;
        if (iVar11._M_current ==
            (this->listOfQueries).super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          __args = &local_980;
          goto LAB_00196581;
        }
LAB_0019656a:
        *iVar11._M_current = pQVar7;
        pppQVar2 = &(this->listOfQueries).super__Vector_base<Query_*,_std::allocator<Query_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppQVar2 = *pppQVar2 + 1;
      }
      uVar9 = uVar12;
      local_948 = uVar13;
      local_928 = uVar12;
      if (uVar13 < 99) {
        do {
          uVar13 = uVar9 >> 6;
          uVar12 = 1L << ((byte)uVar9 & 0x3f);
          if (((local_960->super__Base_bitset<2UL>)._M_w[uVar13] >> (uVar9 & 0x3f) & 1) != 0) {
            memcpy(&local_8b8,&local_7f8,0xc0);
            pQVar7 = (Query *)operator_new(0x30);
            pQVar7->_rootID = 0;
            (pQVar7->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
            (pQVar7->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
            (pQVar7->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pQVar7->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pQVar7->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_980 = pQVar7;
            local_978 = (Query *)operator_new(0x30);
            (local_978->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
            (local_978->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
            (local_978->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (local_978->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (local_978->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_978->_rootID =
                 ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_root->_id;
            if (((this->_categoricalFeatures).super__Base_bitset<2UL>._M_w[local_938] & local_940)
                != 0) {
              local_978->_rootID = this->_queryRootIndex[local_948];
              p_Var3 = (local_978->_fVars).super__Base_bitset<2UL>._M_w + local_938;
              *p_Var3 = *p_Var3 | local_940;
            }
            if (((local_968->super__Base_bitset<2UL>)._M_w[uVar13] & uVar12) == 0) {
              uVar10 = auStack_678[uVar9];
              if (0x5db < uVar10) goto LAB_00196761;
              p_Var3 = local_8b8.super__Base_bitset<24UL>._M_w + (uVar10 >> 6);
              *p_Var3 = *p_Var3 | 1L << ((byte)uVar10 & 0x3f);
            }
            else {
              p_Var3 = (local_978->_fVars).super__Base_bitset<2UL>._M_w + uVar13;
              *p_Var3 = *p_Var3 | uVar12;
              local_978->_rootID = this->_queryRootIndex[uVar9];
            }
            std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
            _M_realloc_insert<std::bitset<1500ul>const&>
                      ((vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)pQVar7,
                       (iterator)0x0,&local_8b8);
            __position._M_current =
                 (local_978->_aggregates).
                 super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (local_978->_aggregates).
                super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<Aggregate*,std::allocator<Aggregate*>>::
              _M_realloc_insert<Aggregate*const&>
                        ((vector<Aggregate*,std::allocator<Aggregate*>> *)&local_978->_aggregates,
                         __position,(Aggregate **)&local_980);
            }
            else {
              *__position._M_current = (Aggregate *)local_980;
              pppAVar1 = &(local_978->_aggregates).
                          super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              *pppAVar1 = *pppAVar1 + 1;
            }
            QueryCompiler::addQuery
                      ((this->_compiler).
                       super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       local_978);
            iVar11._M_current =
                 (this->listOfQueries).super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl
                 .super__Vector_impl_data._M_finish;
            if (iVar11._M_current ==
                (this->listOfQueries).super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<Query*,std::allocator<Query*>>::_M_realloc_insert<Query*const&>
                        (local_970,iVar11,&local_978);
            }
            else {
              *iVar11._M_current = local_978;
              pppQVar2 = &(this->listOfQueries).
                          super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              *pppQVar2 = *pppQVar2 + 1;
            }
          }
          uVar10 = uVar9 - 1;
          uVar9 = uVar9 + 1;
          uVar12 = local_928;
          uVar13 = local_948;
        } while (uVar10 < 0x62);
      }
    }
    uVar13 = uVar13 + 1;
    uVar12 = uVar12 + 1;
    if (uVar13 == 100) {
      return;
    }
  } while( true );
}

Assistant:

void CovarianceMatrix::modelToQueries()
{
    size_t numberOfFunctions = 0;
    size_t featureToFunction[NUM_OF_VARIABLES],
        quadFeatureToFunction[NUM_OF_VARIABLES];
    
    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (_features.test(var) && !_categoricalFeatures.test(var))
        {
            _compiler->addFunction(
                new Function({var}, Operation::sum));
            featureToFunction[var] = numberOfFunctions;
            numberOfFunctions++;
        }
    }

    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (_features.test(var) && !_categoricalFeatures.test(var))
        {
            _compiler->addFunction(
                new Function({var}, Operation::quadratic_sum));
            quadFeatureToFunction[var] = numberOfFunctions;
            numberOfFunctions++;
        }
    }

    Aggregate* agg_count = new Aggregate();
    agg_count->_agg.push_back(prod_bitset());
            
    Query* count = new Query();
    count->_aggregates.push_back(agg_count);
    count->_rootID = _td->_root->_id;
    _compiler->addQuery(count);
    listOfQueries.push_back(count);    
    
    size_t numberOfQueries = 0;
    size_t cont_var_root = _td->_root->_id;

    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (!_features[var])
            continue;
        
        prod_bitset prod_linear_v1;
        prod_bitset prod_quad_v1;

        if (!_categoricalFeatures[var])
        {
            // Linear function per Feature 
            prod_linear_v1.set(featureToFunction[var]);
 
            Aggregate* agg_linear = new Aggregate();
            agg_linear->_agg.push_back(prod_linear_v1);
            
            Query* linear = new Query();
            linear->_aggregates.push_back(agg_linear);
            linear->_rootID = cont_var_root;

            _compiler->addQuery(linear);
            
            listOfQueries.push_back(linear);            
            ++numberOfQueries;            
            
            // Quadratic function for each feature
            prod_quad_v1.set(quadFeatureToFunction[var]);
            
            Aggregate* agg_quad = new Aggregate();
            agg_quad->_agg.push_back(prod_quad_v1);
            
            Query* quad = new Query();
            quad->_aggregates.push_back(agg_quad);
            quad->_rootID = _td->_root->_id; // cont_var_root;

            _compiler->addQuery(quad);
            
            listOfQueries.push_back(quad);
            ++numberOfQueries;
        }
        else
        {
            Aggregate* agg_linear = new Aggregate();
            agg_linear->_agg.push_back(prod_linear_v1);
            
            Query* linear = new Query();
            linear->_aggregates.push_back(agg_linear);
            linear->_fVars.set(var);
            linear->_rootID = _queryRootIndex[var];
            _compiler->addQuery(linear);

            listOfQueries.push_back(linear);
            ++numberOfQueries;
        }
        

        for (size_t var2 = var+1; var2 < NUM_OF_VARIABLES; ++var2)
        {
            if (_features[var2])
            {
                //*****************************************//
                prod_bitset prod_quad_v2 = prod_linear_v1;
                
                Aggregate* agg_quad_v2 = new Aggregate();
                
                Query* quad_v2 = new Query();
                quad_v2->_rootID = _td->_root->_id;

                // if (_categoricalFeatures[var])
                // {
                //     quad_v2->_rootID = _queryRootIndex[var];
                //     quad_v2->_fVars.set(var);
                //     if (_categoricalFeatures[var2])
                //     {
                //         quad_v2->_fVars.set(var2);
                //         // If both varaibles are categoricalVars - we choose the
                //         // var2 as the root
                //         // TODO: We should use the root that is highest to the
                //         // original root
                //         if (_queryRootIndex[var2] <= _queryRootIndex[var])
                //             quad_v2->_rootID = _queryRootIndex[var2];
                //     }
                //     else
                //     {
                //         prod_quad_v2.set(featureToFunction[var2]);
                //     }
                // }
                // else if (_categoricalFeatures[var2])
                // {
                //     quad_v2->_fVars.set(var2);
                //     quad_v2->_rootID = _queryRootIndex[var2];
                // }
                // else
                // {
                //     // create prod_quad_v2 of both var and var2
                //     prod_quad_v2.set(featureToFunction[var2]);                    
                // }
                if (_categoricalFeatures[var])
                {
                    quad_v2->_rootID = _queryRootIndex[var];
                    quad_v2->_fVars.set(var);                    
                }
                
                if (_categoricalFeatures[var2])
                {
                    quad_v2->_fVars.set(var2);
                    // If both varaibles are categoricalVars - we choose the
                    // var2 as the root
                    quad_v2->_rootID = _queryRootIndex[var2];
                }
                else
                {
                    // create prod_quad_v2 of both var and var2
                    prod_quad_v2.set(featureToFunction[var2]);                    
                }
                
                agg_quad_v2->_agg.push_back(prod_quad_v2);
                
                quad_v2->_aggregates.push_back(agg_quad_v2);
                _compiler->addQuery(quad_v2);
                
                // TODO: Here we add both sides! multiply var times param of
                // var2 -- add that to gradient of var. And then multiply var2
                // times param of var and add to gradient of var2! -- this can
                // be done togther in one pass over the vector!

                listOfQueries.push_back(quad_v2);                
                ++numberOfQueries;
                // TODO: once we have identified the queries and how they are
                // multiplied, we then need to identify the actual views that
                // are computed over and use the information group computation
                // over this view!
            }
        }
    }
}